

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlEncodeEntitiesReentrant(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_34;
  int n_input;
  xmlChar *input;
  int n_doc;
  xmlDocPtr doc;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (input._4_4_ = 0; (int)input._4_4_ < 4; input._4_4_ = input._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlDocPtr(input._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      val_01 = (xmlChar *)xmlEncodeEntitiesReentrant(val,val_00);
      desret_xmlChar_ptr(val_01);
      call_tests = call_tests + 1;
      des_xmlDocPtr(input._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)input._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlEncodeEntitiesReentrant(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    xmlDocPtr doc; /* the document containing the string */
    int n_doc;
    const xmlChar * input; /* A string to convert to XML. */
    int n_input;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_input = 0;n_input < gen_nb_const_xmlChar_ptr;n_input++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        input = gen_const_xmlChar_ptr(n_input, 1);

        ret_val = xmlEncodeEntitiesReentrant(doc, input);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_input, input, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_input);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}